

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O1

void __thiscall
QHstsCache::updateKnownHost(QHstsCache *this,QUrl *url,QDateTime *expires,bool includeSubDomains)

{
  char cVar1;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QUrl::isValid();
  if (cVar1 != '\0') {
    QUrl::host(&local_48,url,0x7f00000);
    updateKnownHost(this,&local_48,expires,includeSubDomains);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (this->hstsStore != (QHstsStore *)0x0) {
      QHstsStore::synchronize(this->hstsStore);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHstsCache::updateKnownHost(const QUrl &url, const QDateTime &expires,
                                 bool includeSubDomains)
{
    if (!url.isValid())
        return;

    updateKnownHost(url.host(), expires, includeSubDomains);
#if QT_CONFIG(settings)
    if (hstsStore)
        hstsStore->synchronize();
#endif // QT_CONFIG(settings)
}